

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

int json_print_string(lyout *out,char *text)

{
  byte bVar1;
  int iVar2;
  char *format;
  ulong uVar3;
  int iVar4;
  
  if (text == (char *)0x0) {
    iVar4 = 0;
  }
  else {
    ly_write(out,"\"",1);
    uVar3 = 0;
    iVar4 = 0;
    while( true ) {
      bVar1 = text[uVar3];
      if (bVar1 == 0) break;
      if (bVar1 < 0x20) {
        iVar2 = ly_print(out,"\\u%.4X");
      }
      else {
        if (bVar1 == 0x5c) {
          format = "\\\\";
        }
        else {
          if (bVar1 != 0x22) {
            ly_write(out,text + uVar3,1);
            iVar2 = 1;
            goto LAB_0018fe4f;
          }
          format = "\\\"";
        }
        iVar2 = ly_print(out,format);
      }
LAB_0018fe4f:
      iVar4 = iVar4 + iVar2;
      uVar3 = (ulong)((int)uVar3 + 1);
    }
    ly_write(out,"\"",1);
    iVar4 = iVar4 + 2;
  }
  return iVar4;
}

Assistant:

int
json_print_string(struct lyout *out, const char *text)
{
    unsigned int i, n;

    if (!text) {
        return 0;
    }

    ly_write(out, "\"", 1);
    for (i = n = 0; text[i]; i++) {
        const unsigned char ascii = text[i];
        if (ascii < 0x20) {
            /* control character */
            n += ly_print(out, "\\u%.4X", ascii);
        } else {
            switch (ascii) {
            case '"':
                n += ly_print(out, "\\\"");
                break;
            case '\\':
                n += ly_print(out, "\\\\");
                break;
            default:
                ly_write(out, &text[i], 1);
                n++;
            }
        }
    }
    ly_write(out, "\"", 1);

    return n + 2;
}